

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool room_build(chunk_conflict *c,wchar_t by0,wchar_t bx0,room_profile profile,
                _Bool finds_own_space)

{
  _Bool _Var1;
  loc_conflict lVar2;
  loc centre;
  wchar_t bx2;
  wchar_t by2;
  wchar_t bx1;
  wchar_t by1;
  _Bool finds_own_space_local;
  wchar_t bx0_local;
  wchar_t by0_local;
  chunk_conflict *c_local;
  
  centre.y = by0 + profile.height / dun->block_hgt;
  centre.x = bx0 + profile.width / dun->block_wid;
  event_signal_string(EVENT_GEN_ROOM_START,profile.name);
  if (c->depth < profile.level) {
    event_signal_flag(EVENT_GEN_ROOM_END,false);
    c_local._7_1_ = false;
  }
  else if ((dun->pit_num < (int)(uint)z_info->level_pit_max) ||
          (((undefined1  [56])profile & (undefined1  [56])0x1) == (undefined1  [56])0x0)) {
    if (profile.height % dun->block_hgt != 0) {
      centre.y = centre.y + 1;
    }
    if (profile.width % dun->block_wid != 0) {
      centre.x = centre.x + 1;
    }
    if (finds_own_space) {
      lVar2 = (loc_conflict)loc(c->width,c->height);
      _Var1 = (*profile.builder)((chunk *)c,lVar2,profile.rating);
      if (!_Var1) {
        event_signal_flag(EVENT_GEN_ROOM_END,false);
        return false;
      }
    }
    else {
      _Var1 = check_for_unreserved_blocks(by0,bx0,centre.y,centre.x);
      if (!_Var1) {
        event_signal_flag(EVENT_GEN_ROOM_END,false);
        return false;
      }
      lVar2 = (loc_conflict)
              loc(((bx0 + centre.x + 1) * dun->block_wid) / 2,
                  ((by0 + centre.y + 1) * dun->block_hgt) / 2);
      if (dun->cent_n < (int)(uint)z_info->level_room_max) {
        dun->cent[dun->cent_n] = lVar2;
        dun->cent_n = dun->cent_n + L'\x01';
      }
      _Var1 = (*profile.builder)((chunk *)c,lVar2,profile.rating);
      if (!_Var1) {
        dun->cent_n = dun->cent_n + L'\xffffffff';
        event_signal_flag(EVENT_GEN_ROOM_END,false);
        return false;
      }
      reserve_blocks(by0,bx0,centre.y,centre.x);
    }
    if (((undefined1  [56])profile & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      dun->pit_num = dun->pit_num + L'\x01';
    }
    event_signal_flag(EVENT_GEN_ROOM_END,true);
    c_local._7_1_ = true;
  }
  else {
    event_signal_flag(EVENT_GEN_ROOM_END,false);
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

bool room_build(struct chunk *c, int by0, int bx0, struct room_profile profile,
	bool finds_own_space)
{
	/* Extract blocks */
	int by1 = by0;
	int bx1 = bx0;
	int by2 = by0 + profile.height / dun->block_hgt;
	int bx2 = bx0 + profile.width / dun->block_wid;

	struct loc centre;

	event_signal_string(EVENT_GEN_ROOM_START, profile.name);
	/* Enforce the room profile's minimum depth */
	if (c->depth < profile.level) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Only allow at most two pit/nests room per level */
	if ((dun->pit_num >= z_info->level_pit_max) && (profile.pit)) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Expand the number of blocks if we might overflow */
	if (profile.height % dun->block_hgt) by2++;
	if (profile.width % dun->block_wid) bx2++;

	/* Does the profile allocate space, or the room find it? */
	if (finds_own_space) {
		/* Try to build a room, pass silly place so room finds its own */
		if (!profile.builder(c, loc(c->width, c->height),
				profile.rating)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}
	} else {
		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		/* Get the location of the room */
		centre = loc(((bx1 + bx2 + 1) * dun->block_wid) / 2,
					 ((by1 + by2 + 1) * dun->block_hgt) / 2);

		/* Save the room location (must be before builder call to
		 * properly store entrance information). */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = centre;
			dun->cent_n++;
		}

		/* Try to build a room */
		if (!profile.builder(c, centre, profile.rating)) {
			--dun->cent_n;
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		reserve_blocks(by1, bx1, by2, bx2);
	}

	/* Count pit/nests rooms */
	if (profile.pit) dun->pit_num++;

	/* Success */
	event_signal_flag(EVENT_GEN_ROOM_END, true);
	return true;
}